

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

MultiBranchInstr * IR::MultiBranchInstr::New(OpCode opcode,Opnd *srcOpnd,Func *func)

{
  Func *func_00;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  MultiBranchInstr *pMVar4;
  undefined4 *puVar5;
  
  pMVar4 = New(opcode,func);
  if ((pMVar4->super_BranchInstr).super_Instr.m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_004bd938;
    *puVar5 = 0;
  }
  func_00 = (pMVar4->super_BranchInstr).super_Instr.m_func;
  if (srcOpnd->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_004bd938:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  bVar3 = srcOpnd->field_0xb;
  if ((bVar3 & 2) != 0) {
    srcOpnd = Opnd::Copy(srcOpnd,func_00);
    bVar3 = srcOpnd->field_0xb;
  }
  srcOpnd->field_0xb = bVar3 | 2;
  (pMVar4->super_BranchInstr).super_Instr.m_src1 = srcOpnd;
  return pMVar4;
}

Assistant:

MultiBranchInstr *
MultiBranchInstr::New(Js::OpCode opcode, IR::Opnd * srcOpnd, Func * func)
{
   MultiBranchInstr * multiBranchInstr;

   multiBranchInstr = MultiBranchInstr::New(opcode, func);

   multiBranchInstr->SetSrc1(srcOpnd);

   return multiBranchInstr;
}